

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

size_t secp256k1_pippenger_max_points(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  
  sVar1 = secp256k1_scratch_max_allocation(error_callback,scratch,6);
  lVar7 = 1;
  bVar6 = 2;
  uVar5 = 0;
  while( true ) {
    if (lVar7 == 0xd) {
      return uVar5;
    }
    uVar2 = (ulong)(byte)(0x7f / bVar6);
    uVar4 = (0x80L << ((byte)lVar7 & 0x3f)) + uVar2 * 8 + 0x130;
    if (sVar1 < uVar4) break;
    sVar3 = secp256k1_pippenger_bucket_window_inv((int)lVar7);
    uVar4 = (sVar1 - uVar4) / (uVar2 * 8 + 0x120);
    uVar2 = uVar4;
    if (sVar3 <= uVar4) {
      uVar2 = sVar3;
    }
    if (uVar5 < uVar2) {
      uVar5 = uVar2;
    }
    bVar6 = bVar6 + 1;
    lVar7 = lVar7 + 1;
    if (uVar4 < sVar3) {
      return uVar5;
    }
  }
  return uVar5;
}

Assistant:

static size_t secp256k1_pippenger_max_points(const secp256k1_callback* error_callback, secp256k1_scratch *scratch) {
    size_t max_alloc = secp256k1_scratch_max_allocation(error_callback, scratch, PIPPENGER_SCRATCH_OBJECTS);
    int bucket_window;
    size_t res = 0;

    for (bucket_window = 1; bucket_window <= PIPPENGER_MAX_BUCKET_WINDOW; bucket_window++) {
        size_t n_points;
        size_t max_points = secp256k1_pippenger_bucket_window_inv(bucket_window);
        size_t space_for_points;
        size_t space_overhead;
        size_t entry_size = sizeof(secp256k1_ge) + sizeof(secp256k1_scalar) + sizeof(struct secp256k1_pippenger_point_state) + (WNAF_SIZE(bucket_window+1)+1)*sizeof(int);

        entry_size = 2*entry_size;
        space_overhead = (sizeof(secp256k1_gej) << bucket_window) + entry_size + sizeof(struct secp256k1_pippenger_state);
        if (space_overhead > max_alloc) {
            break;
        }
        space_for_points = max_alloc - space_overhead;

        n_points = space_for_points/entry_size;
        n_points = n_points > max_points ? max_points : n_points;
        if (n_points > res) {
            res = n_points;
        }
        if (n_points < max_points) {
            /* A larger bucket_window may support even more points. But if we
             * would choose that then the caller couldn't safely use any number
             * smaller than what this function returns */
            break;
        }
    }
    return res;
}